

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native.c
# Opt level: O0

int hasLib(char *name)

{
  int iVar1;
  int local_1c;
  int i;
  char *name_local;
  
  local_1c = 0;
  while( true ) {
    if (libCount <= local_1c) {
      return 0;
    }
    iVar1 = strcmp(libraries[local_1c].name,name);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return 1;
}

Assistant:

static int hasLib(char *name){
    int i = 0;
    while(i < libCount){
        if(strcmp(libraries[i].name, name) == 0)
            return 1;
        i++;
    }
    return 0;
}